

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O1

void __thiscall
CharConvUTF8::unpack(CharConvUTF8 *this,vm_val_t *val,CVmDataSource *src,int cnt,char pad)

{
  byte bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  vm_datatype_t *pvVar4;
  vm_val_t *pvVar5;
  uint ch;
  vm_obj_id_t vVar6;
  int iVar7;
  wchar_t wVar8;
  CVmObjString *this_00;
  byte *ptr;
  byte *pbVar9;
  byte *p;
  size_t byte_size;
  
  byte_size = (size_t)cnt;
  vVar6 = CVmObjString::create(0,byte_size);
  val->typ = VM_OBJ;
  (val->val).obj = vVar6;
  pvVar5 = sp_;
  this_00 = (CVmObjString *)
            ((long)&G_obj_table_X.pages_[vVar6 >> 0xc]->ptr_ + (ulong)((vVar6 & 0xfff) * 0x18));
  uVar2 = *(undefined4 *)&val->field_0x4;
  vVar6 = (val->val).obj;
  uVar3 = *(undefined4 *)((long)&val->val + 4);
  pvVar4 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar4 = val->typ;
  *(undefined4 *)&pvVar5->field_0x4 = uVar2;
  (pvVar5->val).obj = vVar6;
  *(undefined4 *)((long)&pvVar5->val + 4) = uVar3;
  if (cnt != 0) {
    iVar7 = (*src->_vptr_CVmDataSource[2])(src,(this_00->super_CVmObject).ext_ + 2,byte_size);
    if (iVar7 != 0) {
      err_throw(0x65);
    }
    CCharmapToUni::validate((this_00->super_CVmObject).ext_ + 2,byte_size);
    pbVar9 = (byte *)0x0;
    ptr = (byte *)((this_00->super_CVmObject).ext_ + byte_size + 2);
    do {
      if (cnt <= (int)pbVar9) goto LAB_0027eeab;
      bVar1 = ptr[-1 - (ulong)(~(uint)(ptr[-1] >> 6) & (uint)(ptr[-1] >> 7))];
      p = ptr + (-1 - (ulong)(~(uint)(ptr[-1] >> 6) & (uint)(ptr[-1] >> 7))) +
          -(ulong)(~(uint)(bVar1 >> 6) & (uint)(bVar1 >> 7));
      pbVar9 = ptr + ((long)pbVar9 - (long)p);
      wVar8 = utf8_ptr::s_getch((char *)p);
      ptr = p;
    } while (wVar8 == pad);
    ptr = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
LAB_0027eeab:
    CVmObjString::cons_shrink_buffer(this_00,(char *)ptr);
  }
  sp_ = sp_ + -1;
  return;
}

Assistant:

virtual void unpack(VMG_ vm_val_t *val, CVmDataSource *src, int cnt,
                        char pad)
    {
        /*
         *   For UTF-8, we can simply read the bytes directly into a string
         *   buffer.  Allocate the string at the required byte size, and push
         *   for gc protection.  
         */
        val->set_obj(CVmObjString::create(vmg_ FALSE, cnt));
        CVmObjString *str = (CVmObjString *)vm_objp(vmg_ val->val.obj);
        G_stk->push(val);

        /* if the read count is non-zero, read the data */
        if (cnt != 0)
        {
            /* read the data directly into the string buffer */
            if (src->read(str->cons_get_buf(), cnt))
                err_throw(VMERR_READ_FILE);

            /* validate the UTF-8 */
            CCharmapToUni::validate(str->cons_get_buf(), cnt);

            /* remove trailing padding */
            utf8_ptr p(str->cons_get_buf() + cnt);
            for (size_t rem = 0 ; (int)rem < cnt ; )
            {
                /* 
                 *   move to the previous character; if it's not the padding
                 *   character, we're done 
                 */
                p.dec(&rem);
                if (p.getch() != pad)
                {
                    p.inc(&rem);
                    break;
                }
            }

            /* set the string length to the length without the padding */
            str->cons_shrink_buffer(vmg_ p.getptr());
        }

        /* done with the gc protection */
        G_stk->discard();
    }